

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O0

iterator __thiscall
threadsafe::ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link>::erase
          (ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link> *this,iterator *start,iterator *end
          )

{
  bool bVar1;
  Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *in_RCX;
  Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> local_38;
  iterator *end_local;
  iterator *start_local;
  ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link> *this_local;
  
  end_local = end;
  start_local = start;
  this_local = this;
  while( true ) {
    bVar1 = impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::operator!=(end,in_RCX);
    if (!bVar1) break;
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::Iterator(&local_38,end);
    erase((ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link> *)&stack0xffffffffffffffd0,start);
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::operator=
              (end,(Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *)
                   &stack0xffffffffffffffd0);
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::~Iterator
              ((Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *)&stack0xffffffffffffffd0
              );
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::~Iterator(&local_38);
  }
  impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::Iterator
            ((Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *)this,end);
  return (iterator)&this->root_;
}

Assistant:

iterator erase(iterator start, iterator end) {
        for(; start != end;) {
            start = erase(start);
        }
        return start;
    }